

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Instr * __thiscall FlowGraph::PeepCm(FlowGraph *this,Instr *instr)

{
  OpCode OVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  RegSlot reg;
  uint32 uVar8;
  uint32 uVar9;
  Instr *this_01;
  Opnd *pOVar10;
  Opnd *pOVar11;
  StackSym *pSVar12;
  undefined4 *puVar13;
  ScriptContextInfo *pSVar14;
  undefined4 extraout_var;
  AddrOpnd *this_02;
  undefined4 extraout_var_00;
  AddrOpnd *this_03;
  BranchInstr *pBVar15;
  Instr *pIVar16;
  RegOpnd *pRVar17;
  LabelInstr *pLVar18;
  Opnd *opnd;
  LabelInstr *local_110;
  LabelInstr *brTarget2;
  StackSym *symLd3;
  Instr *pIStack_f8;
  bool brIsTrue2;
  Instr *inlineeEndInstr2;
  Instr *instrBr2;
  Instr *local_e0;
  Instr *instrLd3;
  undefined1 local_c8 [8];
  AutoReuseOpnd brSrcAutoCopy;
  StackSym *dstSym;
  AddrOpnd *falseOpnd;
  AddrOpnd *trueOpnd;
  uint32 local_88;
  OpCode newOpcode;
  bool origBranchSrcOpndIsJITOpt;
  uint32 origBranchSrcSymId;
  uint32 origBrByteCodeOffset;
  Func *origBrFunc;
  Instr *instrBr;
  Opnd *pOStack_68;
  bool brIsTrue;
  Opnd *brSrc;
  bool ldFound;
  Instr *instrByteCode;
  Instr *instrLd2;
  Instr *instrLd;
  Instr *instrNew;
  Instr *inlineeEndInstr;
  Instr *instrNext;
  Func *func;
  Instr *instr_local;
  FlowGraph *this_local;
  
  this_00 = instr->m_func;
  this_01 = IR::Instr::GetNextRealInstrOrLabel(instr);
  instrNew = (Instr *)0x0;
  instrLd2 = (Instr *)0x0;
  instrByteCode = (Instr *)0x0;
  bVar6 = false;
  pOStack_68 = IR::Instr::GetDst(instr);
  inlineeEndInstr = this_01;
  if (this_01->m_opcode == Ld_A) {
    pOVar10 = IR::Instr::GetSrc1(this_01);
    pOVar11 = IR::Instr::GetDst(instr);
    bVar3 = IR::Opnd::IsEqual(pOVar10,pOVar11);
    if (bVar3) {
      bVar6 = true;
      pOStack_68 = IR::Instr::GetDst(this_01);
      pOVar10 = IR::Instr::GetSrc1(instr);
      bVar3 = IR::Opnd::IsEqual(pOStack_68,pOVar10);
      if (bVar3) {
        return (Instr *)0x0;
      }
      pOVar10 = IR::Instr::GetSrc2(instr);
      bVar3 = IR::Opnd::IsEqual(pOStack_68,pOVar10);
      if (bVar3) {
        return (Instr *)0x0;
      }
      inlineeEndInstr = IR::Instr::GetNextRealInstrOrLabel(this_01);
      instrLd2 = this_01;
      if (inlineeEndInstr->m_opcode == Ld_A) {
        pOVar10 = IR::Instr::GetSrc1(inlineeEndInstr);
        bVar3 = IR::Opnd::IsEqual(pOVar10,pOStack_68);
        if (bVar3) {
          pOStack_68 = IR::Instr::GetDst(inlineeEndInstr);
          pIVar16 = IR::Instr::GetNextRealInstrOrLabel(inlineeEndInstr);
          pOVar10 = IR::Instr::GetSrc1(instr);
          bVar3 = IR::Opnd::IsEqual(pOStack_68,pOVar10);
          if (bVar3) {
            return (Instr *)0x0;
          }
          pOVar10 = IR::Instr::GetSrc2(instr);
          bVar3 = IR::Opnd::IsEqual(pOStack_68,pOVar10);
          instrByteCode = inlineeEndInstr;
          inlineeEndInstr = pIVar16;
          if (bVar3) {
            return (Instr *)0x0;
          }
        }
      }
    }
  }
  if (inlineeEndInstr->m_opcode == InlineeEnd) {
    instrNew = inlineeEndInstr;
    inlineeEndInstr = IR::Instr::GetNextRealInstrOrLabel(inlineeEndInstr);
  }
  if (inlineeEndInstr->m_opcode == BrTrue_A) {
    bVar3 = true;
  }
  else {
    if (inlineeEndInstr->m_opcode != BrFalse_A) {
      return (Instr *)0x0;
    }
    bVar3 = false;
  }
  pOVar10 = IR::Instr::GetDst(instr);
  pOVar11 = IR::Instr::GetSrc1(inlineeEndInstr);
  bVar4 = IR::Opnd::IsEqual(pOVar10,pOVar11);
  if (!bVar4) {
    pOVar10 = IR::Instr::GetSrc1(inlineeEndInstr);
    bVar4 = IR::Opnd::IsEqual(pOStack_68,pOVar10);
    if (!bVar4) {
      return (Instr *)0x0;
    }
  }
  _origBranchSrcSymId = inlineeEndInstr->m_func;
  _newOpcode = IR::Instr::GetByteCodeOffset(inlineeEndInstr);
  pOVar10 = IR::Instr::GetSrc1(inlineeEndInstr);
  pSVar12 = IR::Opnd::GetStackSym(pOVar10);
  local_88 = (pSVar12->super_Sym).m_id;
  pOVar10 = IR::Instr::GetSrc1(inlineeEndInstr);
  bVar4 = IR::Opnd::GetIsJITOptimizedReg(pOVar10);
  IR::Instr::Unlink(inlineeEndInstr);
  IR::Instr::InsertBefore(instr,inlineeEndInstr);
  IR::Instr::ClearByteCodeOffset(inlineeEndInstr);
  IR::Instr::SetByteCodeOffset(inlineeEndInstr,instr);
  IR::Instr::FreeSrc1(inlineeEndInstr);
  pOVar10 = IR::Instr::UnlinkSrc1(instr);
  IR::Instr::SetSrc1(inlineeEndInstr,pOVar10);
  pOVar10 = IR::Instr::UnlinkSrc2(instr);
  IR::Instr::SetSrc2(inlineeEndInstr,pOVar10);
  inlineeEndInstr->m_func = instr->m_func;
  trueOpnd._4_2_ = InvalidOpCode;
  OVar1 = instr->m_opcode;
  if (OVar1 == CmEq_A) {
    trueOpnd._4_2_ = BrEq_A;
  }
  else if (OVar1 == CmGe_A) {
    trueOpnd._4_2_ = BrGe_A;
  }
  else if (OVar1 == CmGt_A) {
    trueOpnd._4_2_ = BrGt_A;
  }
  else if (OVar1 == CmLt_A) {
    trueOpnd._4_2_ = BrLt_A;
  }
  else if (OVar1 == CmLe_A) {
    trueOpnd._4_2_ = BrLe_A;
  }
  else if (OVar1 == CmNeq_A) {
    trueOpnd._4_2_ = BrNeq_A;
  }
  else if (OVar1 == CmSrEq_A) {
    trueOpnd._4_2_ = BrSrEq_A;
  }
  else if (OVar1 == CmSrNeq_A) {
    trueOpnd._4_2_ = BrSrNeq_A;
  }
  else if (OVar1 == CmUnGe_A) {
    trueOpnd._4_2_ = BrUnGe_A;
  }
  else if (OVar1 == CmUnGt_A) {
    trueOpnd._4_2_ = BrUnGt_A;
  }
  else if (OVar1 == CmUnLt_A) {
    trueOpnd._4_2_ = BrUnLt_A;
  }
  else if (OVar1 == CmUnLe_A) {
    trueOpnd._4_2_ = BrUnLe_A;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xb20,"((0))","UNREACHED");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  inlineeEndInstr->m_opcode = trueOpnd._4_2_;
  pSVar14 = Func::GetScriptContextInfo(this_00);
  iVar7 = (*pSVar14->_vptr_ScriptContextInfo[2])();
  this_02 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar7),AddrOpndKindDynamicVar,this_00,true,
                              (Var)0x0);
  pSVar14 = Func::GetScriptContextInfo(this_00);
  iVar7 = (*pSVar14->_vptr_ScriptContextInfo[3])();
  this_03 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar7),AddrOpndKindDynamicVar,this_00,true,
                              (Var)0x0);
  IR::Opnd::SetValueType(&this_02->super_Opnd,ValueType::Boolean);
  IR::Opnd::SetValueType(&this_03->super_Opnd,ValueType::Boolean);
  if (!bVar3) {
    pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
    IR::BranchInstr::Invert(pBVar15);
  }
  if (bVar6) {
    if (bVar3 == false) {
      pOVar10 = IR::Instr::GetSrc1(instrLd2);
      pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_03->super_Opnd,inlineeEndInstr->m_func);
      IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
      IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
      pOVar10 = IR::Instr::GetDst(pIVar16);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      pOVar10 = IR::Instr::GetDst(instrLd2);
      pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_03->super_Opnd,inlineeEndInstr->m_func);
      IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
      IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
      pOVar10 = IR::Instr::GetDst(pIVar16);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      pOVar10 = IR::Instr::GetSrc1(instrLd2);
      pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_02->super_Opnd,instrLd2->m_func);
      IR::Instr::InsertBefore(instrLd2,pIVar16);
      IR::Instr::SetByteCodeOffset(pIVar16,instrLd2);
      IR::Instr::ReplaceSrc1(instrLd2,&this_02->super_Opnd);
      pOVar10 = IR::Instr::GetDst(pIVar16);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      if (instrByteCode != (Instr *)0x0) {
        IR::Instr::ReplaceSrc1(instrByteCode,&this_02->super_Opnd);
        pOVar10 = IR::Instr::GetDst(instrByteCode);
        pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_03->super_Opnd,inlineeEndInstr->m_func);
        IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
        IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
        pOVar10 = IR::Instr::GetDst(pIVar16);
        pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
        pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      }
    }
    else {
      pOVar10 = IR::Instr::GetSrc1(instrLd2);
      pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_02->super_Opnd,inlineeEndInstr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
      pOVar10 = IR::Instr::GetDst(pIVar16);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
      pOVar10 = IR::Instr::GetDst(instrLd2);
      pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_02->super_Opnd,inlineeEndInstr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
      pOVar10 = IR::Instr::GetDst(pIVar16);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
      pOVar10 = IR::Instr::GetSrc1(instrLd2);
      pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_03->super_Opnd,instrLd2->m_func);
      IR::Instr::InsertBefore(instrLd2,pIVar16);
      IR::Instr::SetByteCodeOffset(pIVar16,instrLd2);
      pOVar10 = IR::Instr::GetDst(pIVar16);
      pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      IR::Instr::ReplaceSrc1(instrLd2,&this_03->super_Opnd);
      if (instrByteCode != (Instr *)0x0) {
        IR::Instr::ReplaceSrc1(instrByteCode,&this_03->super_Opnd);
        pOVar10 = IR::Instr::GetDst(instrByteCode);
        pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_02->super_Opnd,inlineeEndInstr->m_func);
        IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
        IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
        pOVar10 = IR::Instr::GetDst(pIVar16);
        pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
        pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
      }
    }
  }
  if (instrNew != (Instr *)0x0) {
    pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
    InsertInlineeOnFLowEdge
              (this,pBVar15,instrNew,this_01,_origBranchSrcSymId,_newOpcode,bVar4,local_88);
  }
  pOVar10 = IR::Instr::GetDst(instr);
  pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
  bVar6 = StackSym::HasByteCodeRegSlot(pRVar17->m_sym);
  if (bVar6) {
    pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
    bVar6 = IR::BranchInstr::HasByteCodeReg(pBVar15);
    if (bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xb73,"(!instrBr->AsBranchInstr()->HasByteCodeReg())",
                         "!instrBr->AsBranchInstr()->HasByteCodeReg()");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pOVar10 = IR::Instr::GetDst(instr);
    pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
    brSrcAutoCopy._16_8_ = pRVar17->m_sym;
    pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
    reg = StackSym::GetByteCodeRegSlot((StackSym *)brSrcAutoCopy._16_8_);
    IR::BranchInstr::SetByteCodeReg(pBVar15,reg);
  }
  pOVar10 = IR::Opnd::Copy(pOStack_68,this->func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_c8,pOVar10,this->func,true);
  IR::Instr::Remove(instr);
  pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
  pLVar18 = IR::BranchInstr::GetTarget(pBVar15);
  local_e0 = IR::Instr::GetNextRealInstrOrLabel(&pLVar18->super_Instr);
  while (local_e0->m_opcode == Br) {
    pBVar15 = IR::Instr::AsBranchInstr(local_e0);
    pLVar18 = IR::BranchInstr::GetTarget(pBVar15);
    local_e0 = IR::Instr::GetNextRealInstrOrLabel(&pLVar18->super_Instr);
  }
  if (local_e0->m_opcode == Ld_A) {
    pIVar16 = IR::Instr::GetNextRealInstrOrLabel(local_e0);
    pIStack_f8 = (Instr *)0x0;
    inlineeEndInstr2 = pIVar16;
    if ((pIVar16->m_opcode == InlineeEnd) && (instrNew == (Instr *)0x0)) {
      inlineeEndInstr2 = IR::Instr::GetNextRealInstrOrLabel(pIVar16);
      pIStack_f8 = pIVar16;
    }
    if (inlineeEndInstr2->m_opcode == BrTrue_A) {
      symLd3._7_1_ = true;
    }
    else {
      if (inlineeEndInstr2->m_opcode != BrFalse_A) {
        this_local = (FlowGraph *)0x0;
        goto LAB_00532583;
      }
      symLd3._7_1_ = false;
    }
    pOVar11 = IR::Instr::GetDst(local_e0);
    opnd = IR::Instr::GetSrc1(inlineeEndInstr2);
    bVar6 = IR::Opnd::IsEqual(pOVar11,opnd);
    if (bVar6) {
      pOVar11 = IR::Instr::GetSrc1(local_e0);
      bVar6 = IR::Opnd::IsEqual(pOVar10,pOVar11);
      if (bVar6) {
        pOVar10 = IR::Instr::GetDst(local_e0);
        pOVar11 = IR::Instr::GetSrc1(inlineeEndInstr);
        bVar6 = IR::Opnd::IsEqual(pOVar10,pOVar11);
        if (!bVar6) {
          pOVar10 = IR::Instr::GetDst(local_e0);
          pOVar11 = IR::Instr::GetSrc2(inlineeEndInstr);
          bVar6 = IR::Opnd::IsEqual(pOVar10,pOVar11);
          if (!bVar6) {
            uVar8 = IR::Instr::GetByteCodeOffset(local_e0);
            uVar9 = IR::Instr::GetByteCodeOffset(inlineeEndInstr);
            if (uVar9 < uVar8) {
              pOVar10 = IR::Instr::GetDst(local_e0);
              pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
              bVar6 = IR::Instr::HasSymUseInRange(pRVar17->m_sym,inlineeEndInstr->m_next,local_e0);
              if (bVar6) {
                this_local = (FlowGraph *)0x0;
                goto LAB_00532583;
              }
            }
            if (pIStack_f8 != (Instr *)0x0) {
              _origBranchSrcSymId = inlineeEndInstr2->m_func;
              _newOpcode = IR::Instr::GetByteCodeOffset(inlineeEndInstr2);
              pOVar10 = IR::Instr::GetSrc1(inlineeEndInstr2);
              pSVar12 = IR::Opnd::GetStackSym(pOVar10);
              local_88 = (pSVar12->super_Sym).m_id;
            }
            if (bVar3 == false) {
              pOVar10 = IR::Instr::GetDst(local_e0);
              pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_03->super_Opnd,inlineeEndInstr->m_func);
              IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
              IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
              pOVar10 = IR::Instr::GetDst(pIVar16);
              pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
              pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
            }
            else {
              pOVar10 = IR::Instr::GetDst(local_e0);
              pIVar16 = IR::Instr::New(Ld_A,pOVar10,&this_02->super_Opnd,inlineeEndInstr->m_func);
              IR::Instr::InsertBefore(inlineeEndInstr,pIVar16);
              IR::Instr::SetByteCodeOffset(pIVar16,inlineeEndInstr);
              pOVar10 = IR::Instr::GetDst(pIVar16);
              pRVar17 = IR::Opnd::AsRegOpnd(pOVar10);
              pRVar17->field_0x18 = pRVar17->field_0x18 & 0xf7 | 8;
            }
            if (symLd3._7_1_ == bVar3) {
              pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr2);
              local_110 = IR::BranchInstr::GetTarget(pBVar15);
            }
            else {
              local_110 = IR::LabelInstr::New(Label,inlineeEndInstr2->m_func,false);
              IR::Instr::SetByteCodeOffset(&local_110->super_Instr,inlineeEndInstr2->m_next);
              IR::Instr::InsertAfter(inlineeEndInstr2,&local_110->super_Instr);
            }
            pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
            IR::BranchInstr::SetTarget(pBVar15,local_110);
            if (pIStack_f8 != (Instr *)0x0) {
              pBVar15 = IR::Instr::AsBranchInstr(inlineeEndInstr);
              InsertInlineeOnFLowEdge
                        (this,pBVar15,pIStack_f8,this_01,_origBranchSrcSymId,_newOpcode,bVar4,
                         local_88);
            }
            this_local = (FlowGraph *)inlineeEndInstr;
            goto LAB_00532583;
          }
        }
        this_local = (FlowGraph *)0x0;
        goto LAB_00532583;
      }
    }
    this_local = (FlowGraph *)0x0;
  }
  else {
    this_local = (FlowGraph *)inlineeEndInstr;
  }
LAB_00532583:
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c8);
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
FlowGraph::PeepCm(IR::Instr *instr)
{
    // Basic pattern, peep:
    //      t1 = CmEq a, b
    //      t2 = Ld_A t1
    //      BrTrue $L1, t2
    // Into:
    //      t1 = True
    //      t2 = True
    //      BrEq $L1, a, b
    //      t1 = False
    //      t2 = False
    //
    //  The true/false Ld_A's will most likely end up being dead-stores...

    //  Alternate Pattern
    //      t1= CmEq a, b
    //      BrTrue $L1, t1
    // Into:
    //      BrEq $L1, a, b

    Func *func = instr->m_func;

    // Find Ld_A
    IR::Instr *instrNext = instr->GetNextRealInstrOrLabel();
    IR::Instr *inlineeEndInstr = nullptr;
    IR::Instr *instrNew;
    IR::Instr *instrLd = nullptr, *instrLd2 = nullptr;
    IR::Instr *instrByteCode = instrNext;
    bool ldFound = false;
    IR::Opnd *brSrc = instr->GetDst();

    if (instrNext->m_opcode == Js::OpCode::Ld_A && instrNext->GetSrc1()->IsEqual(instr->GetDst()))
    {
        ldFound = true;
        instrLd = instrNext;
        brSrc = instrNext->GetDst();

        if (brSrc->IsEqual(instr->GetSrc1()) || brSrc->IsEqual(instr->GetSrc2()))
        {
            return nullptr;
        }

        instrNext = instrLd->GetNextRealInstrOrLabel();

        // Is there a second Ld_A?
        if (instrNext->m_opcode == Js::OpCode::Ld_A && instrNext->GetSrc1()->IsEqual(brSrc))
        {
            // We have:
            //      t1 = Cm
            //      t2 = t1     // ldSrc = t1
            //      t3 = t2     // ldDst = t3
            //      BrTrue/BrFalse t3

            instrLd2 = instrNext;
            brSrc = instrLd2->GetDst();
            instrNext = instrLd2->GetNextRealInstrOrLabel();
            if (brSrc->IsEqual(instr->GetSrc1()) || brSrc->IsEqual(instr->GetSrc2()))
            {
                return nullptr;
            }
        }
    }

    // Skip over InlineeEnd
    if (instrNext->m_opcode == Js::OpCode::InlineeEnd)
    {
        inlineeEndInstr = instrNext;
        instrNext = inlineeEndInstr->GetNextRealInstrOrLabel();
    }

    // Find BrTrue/BrFalse
    bool brIsTrue;
    if (instrNext->m_opcode == Js::OpCode::BrTrue_A)
    {
        brIsTrue = true;
    }
    else if (instrNext->m_opcode == Js::OpCode::BrFalse_A)
    {
        brIsTrue = false;
    }
    else
    {
        return nullptr;
    }

    IR::Instr *instrBr = instrNext;

    // Make sure we have:
    //      t1 = Ld_A
    //         BrTrue/BrFalse t1
    if (!instr->GetDst()->IsEqual(instrBr->GetSrc1()) && !brSrc->IsEqual(instrBr->GetSrc1()))
    {
        return nullptr;
    }

    //
    // We have a match.  Generate the new branch
    //

    // BrTrue/BrFalse t1
    // Keep a copy of the inliner func and the bytecode offset of the original BrTrue/BrFalse if we end up inserting a new branch out of the inlinee,
    // and sym id of t1 for proper restoration on a bailout before the branch.
    Func* origBrFunc = instrBr->m_func;
    uint32 origBrByteCodeOffset = instrBr->GetByteCodeOffset();
    uint32 origBranchSrcSymId = instrBr->GetSrc1()->GetStackSym()->m_id;
    bool origBranchSrcOpndIsJITOpt = instrBr->GetSrc1()->GetIsJITOptimizedReg();

    instrBr->Unlink();
    instr->InsertBefore(instrBr);
    instrBr->ClearByteCodeOffset();
    instrBr->SetByteCodeOffset(instr);
    instrBr->FreeSrc1();
    instrBr->SetSrc1(instr->UnlinkSrc1());
    instrBr->SetSrc2(instr->UnlinkSrc2());
    instrBr->m_func = instr->m_func;

    Js::OpCode newOpcode = Js::OpCode::InvalidOpCode;

    switch(instr->m_opcode)
    {
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }

    instrBr->m_opcode = newOpcode;

    IR::AddrOpnd* trueOpnd = IR::AddrOpnd::New(func->GetScriptContextInfo()->GetTrueAddr(), IR::AddrOpndKindDynamicVar, func, true);
    IR::AddrOpnd* falseOpnd = IR::AddrOpnd::New(func->GetScriptContextInfo()->GetFalseAddr(), IR::AddrOpndKindDynamicVar, func, true);

    trueOpnd->SetValueType(ValueType::Boolean);
    falseOpnd->SetValueType(ValueType::Boolean);

    if (!brIsTrue)
    {
        instrBr->AsBranchInstr()->Invert();
    }

    if (ldFound)
    {
        // Split Ld_A into "Ld_A TRUE"/"Ld_A FALSE"
        if (brIsTrue)
        {
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), trueOpnd, instrBr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrBr->InsertBefore(instrNew);
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetDst(), trueOpnd, instrBr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrBr->InsertBefore(instrNew);

            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), falseOpnd, instrLd->m_func);
            instrLd->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrLd);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrLd->ReplaceSrc1(falseOpnd);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(falseOpnd);

                instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd2->GetDst(), trueOpnd, instrBr->m_func);
                instrBr->InsertBefore(instrNew);
                instrNew->SetByteCodeOffset(instrBr);
                instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            }
        }
        else
        {
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), falseOpnd, instrBr->m_func);
            instrBr->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetDst(), falseOpnd, instrBr->m_func);
            instrBr->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;

            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), trueOpnd, instrLd->m_func);
            instrLd->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrLd);
            instrLd->ReplaceSrc1(trueOpnd);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(trueOpnd);
                instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd2->GetDst(), falseOpnd, instrBr->m_func);
                instrBr->InsertBefore(instrNew);
                instrNew->SetByteCodeOffset(instrBr);
                instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            }
        }
    }

    // Fix InlineeEnd
    if (inlineeEndInstr)
    {
        this->InsertInlineeOnFLowEdge(instrBr->AsBranchInstr(), inlineeEndInstr, instrByteCode , origBrFunc, origBrByteCodeOffset, origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    }

    if (instr->GetDst()->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        Assert(!instrBr->AsBranchInstr()->HasByteCodeReg());
        StackSym *dstSym = instr->GetDst()->AsRegOpnd()->m_sym;
        instrBr->AsBranchInstr()->SetByteCodeReg(dstSym->GetByteCodeRegSlot());
    }

    brSrc = brSrc->Copy(this->func);
    // We need brSrc later, but instr->Remove() might delete it...
    IR::AutoReuseOpnd brSrcAutoCopy(brSrc, this->func, true);
    instr->Remove();

    //
    // Try optimizing through a second branch.
    // Peep:
    //
    //      t2 = True;
    //      BrTrue  $L1
    //      ...
    //   L1:
    //      t1 = Ld_A t2
    //      BrTrue  $L2
    //
    // Into:
    //      t2 = True;
    //      t1 = True;
    //      BrTrue  $L2 <---
    //      ...
    //   L1:
    //      t1 = Ld_A t2
    //      BrTrue  $L2
    //
    // This cleanup helps expose second level Cm peeps.

    IR::Instr *instrLd3 = instrBr->AsBranchInstr()->GetTarget()->GetNextRealInstrOrLabel();

    // Skip over branch to branch
    while (instrLd3->m_opcode == Js::OpCode::Br)
    {
        instrLd3 = instrLd3->AsBranchInstr()->GetTarget()->GetNextRealInstrOrLabel();
    }

    // Find Ld_A
    if (instrLd3->m_opcode != Js::OpCode::Ld_A)
    {
        return instrBr;
    }

    IR::Instr *instrBr2 = instrLd3->GetNextRealInstrOrLabel();
    IR::Instr *inlineeEndInstr2 = nullptr;

    // InlineeEnd?
    // REVIEW: Can we handle 2 inlineeEnds?
    if (instrBr2->m_opcode == Js::OpCode::InlineeEnd && !inlineeEndInstr)
    {
        inlineeEndInstr2 = instrBr2;
        instrBr2 = instrBr2->GetNextRealInstrOrLabel();
    }

    // Find branch
    bool brIsTrue2;
    if (instrBr2->m_opcode == Js::OpCode::BrTrue_A)
    {
        brIsTrue2 = true;
    }
    else if (instrBr2->m_opcode == Js::OpCode::BrFalse_A)
    {
        brIsTrue2 = false;
    }
    else
    {
        return nullptr;
    }

    // Make sure Ld_A operates on the right tmps.
    if (!instrLd3->GetDst()->IsEqual(instrBr2->GetSrc1()) || !brSrc->IsEqual(instrLd3->GetSrc1()))
    {
        return nullptr;
    }

    if (instrLd3->GetDst()->IsEqual(instrBr->GetSrc1()) || instrLd3->GetDst()->IsEqual(instrBr->GetSrc2()))
    {
        return nullptr;
    }

    // Make sure that the reg we're assigning to is not live in the intervening instructions (if this is a forward branch).
    if (instrLd3->GetByteCodeOffset() > instrBr->GetByteCodeOffset())
    {
        StackSym *symLd3 = instrLd3->GetDst()->AsRegOpnd()->m_sym;
        if (IR::Instr::HasSymUseInRange(symLd3, instrBr->m_next, instrLd3))
        {
            return nullptr;
        }
    }

    //
    // We have a match!
    //

    if(inlineeEndInstr2)
    {
        origBrFunc = instrBr2->m_func;
        origBrByteCodeOffset = instrBr2->GetByteCodeOffset();
        origBranchSrcSymId = instrBr2->GetSrc1()->GetStackSym()->m_id;
    }

    // Fix Ld_A
    if (brIsTrue)
    {
        instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd3->GetDst(), trueOpnd, instrBr->m_func);
        instrBr->InsertBefore(instrNew);
        instrNew->SetByteCodeOffset(instrBr);
        instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
    }
    else
    {
        instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd3->GetDst(), falseOpnd, instrBr->m_func);
        instrBr->InsertBefore(instrNew);
        instrNew->SetByteCodeOffset(instrBr);
        instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
    }

    IR::LabelInstr *brTarget2;

    // Retarget branch
    if (brIsTrue2 == brIsTrue)
    {
        brTarget2 = instrBr2->AsBranchInstr()->GetTarget();
    }
    else
    {
        brTarget2 = IR::LabelInstr::New(Js::OpCode::Label, instrBr2->m_func);
        brTarget2->SetByteCodeOffset(instrBr2->m_next);
        instrBr2->InsertAfter(brTarget2);
    }

    instrBr->AsBranchInstr()->SetTarget(brTarget2);

    // InlineeEnd?
    if (inlineeEndInstr2)
    {
        this->InsertInlineeOnFLowEdge(instrBr->AsBranchInstr(), inlineeEndInstr2, instrByteCode, origBrFunc, origBrByteCodeOffset, origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    }

    return instrBr;
}